

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefSite.h
# Opt level: O2

DefSiteSet * __thiscall
dg::dda::DefSiteSet::intersect(DefSiteSet *__return_storage_ptr__,DefSiteSet *this,DefSiteSet *rhs)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  _List_node_base *p_Var5;
  Offset OVar6;
  _List_node_base *p_Var7;
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  rhssites;
  map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  lhssites;
  pair<dg::Offset,_dg::Offset> local_a8;
  _Rb_tree_node_base *local_98;
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  local_90;
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var3 = (this->
                super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 !=
      &(this->
       super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       )._M_t._M_impl.super__Rb_tree_header; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pmVar2 = std::
             map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
             ::operator[]((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                           *)&local_60,(key_type *)(p_Var3 + 1));
    local_a8 = GenericDefSite<dg::dda::RWNode>::getInterval
                         ((GenericDefSite<dg::dda::RWNode> *)(p_Var3 + 1));
    IntervalsList::add(pmVar2,(Interval *)&local_a8);
  }
  for (p_Var3 = (rhs->
                super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 !=
      &(rhs->
       super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       )._M_t._M_impl.super__Rb_tree_header; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pmVar2 = std::
             map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
             ::operator[]((map<dg::dda::RWNode_*,_dg::dda::IntervalsList,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
                           *)&local_90,(key_type *)(p_Var3 + 1));
    local_a8 = GenericDefSite<dg::dda::RWNode>::getInterval
                         ((GenericDefSite<dg::dda::RWNode> *)(p_Var3 + 1));
    IntervalsList::add(pmVar2,(Interval *)&local_a8);
  }
  p_Var1 = &(__return_storage_ptr__->
            super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
            )._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->
  super_set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header) {
    local_98 = p_Var3;
    iVar4 = std::
            _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
            ::find(&local_90,(key_type *)(p_Var3 + 1));
    if ((_Rb_tree_header *)iVar4._M_node != &local_90._M_impl.super__Rb_tree_header) {
      p_Var5 = (_List_node_base *)
               IntervalsList::intersectWith
                         ((IntervalsList *)&local_98[1]._M_parent,
                          (IntervalsList *)&iVar4._M_node[1]._M_parent);
      p_Var7 = p_Var5;
      while (p_Var7 = (((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                         *)&p_Var7->_M_next)->
                      super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                      )._M_impl._M_node.super__List_node_base._M_next, p_Var7 != p_Var5) {
        OVar6 = IntervalsList::Interval::length((Interval *)(p_Var7 + 1));
        local_a8.first.offset = OVar6.offset;
        std::
        _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
        ::_M_emplace_unique<dg::dda::RWNode*const&,dg::Offset_const&,dg::Offset>
                  ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                    *)__return_storage_ptr__,(RWNode **)(p_Var3 + 1),(Offset *)(p_Var7 + 1),
                   &local_a8.first);
      }
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(local_98);
  }
  std::
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>,_std::_Select1st<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>,_std::less<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::dda::IntervalsList>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

DefSiteSet intersect(const DefSiteSet &rhs) const {
        std::map<DefSite::NodeTy *, IntervalsList> lhssites;
        std::map<DefSite::NodeTy *, IntervalsList> rhssites;

        for (const auto &ds : *this) {
            lhssites[ds.target].add(ds.getInterval());
        }
        for (const auto &ds : rhs) {
            rhssites[ds.target].add(ds.getInterval());
        }

        DefSiteSet retval;

        for (auto &lit : lhssites) {
            auto rit = rhssites.find(lit.first);
            if (rit != rhssites.end()) {
                for (const auto &I : lit.second.intersectWith(rit->second)) {
                    retval.emplace(lit.first, I.start, I.length());
                }
            }
        }

        return retval;
    }